

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_read_params(mbedtls_dhm_context *ctx,uchar **p,uchar *end)

{
  size_t sVar1;
  int local_2c;
  int ret;
  uchar *end_local;
  uchar **p_local;
  mbedtls_dhm_context *ctx_local;
  
  local_2c = dhm_read_bignum(&ctx->P,p,end);
  if (((local_2c == 0) && (local_2c = dhm_read_bignum(&ctx->G,p,end), local_2c == 0)) &&
     (local_2c = dhm_read_bignum(&ctx->GY,p,end), local_2c == 0)) {
    ctx_local._4_4_ = dhm_check_range(&ctx->GY,&ctx->P);
    if (ctx_local._4_4_ == 0) {
      sVar1 = mbedtls_mpi_size(&ctx->P);
      ctx->len = sVar1;
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = local_2c;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_dhm_read_params( mbedtls_dhm_context *ctx,
                     unsigned char **p,
                     const unsigned char *end )
{
    int ret;

    if( ( ret = dhm_read_bignum( &ctx->P,  p, end ) ) != 0 ||
        ( ret = dhm_read_bignum( &ctx->G,  p, end ) ) != 0 ||
        ( ret = dhm_read_bignum( &ctx->GY, p, end ) ) != 0 )
        return( ret );

    if( ( ret = dhm_check_range( &ctx->GY, &ctx->P ) ) != 0 )
        return( ret );

    ctx->len = mbedtls_mpi_size( &ctx->P );

    return( 0 );
}